

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImGuiRenderer.cpp
# Opt level: O2

void __thiscall
myvk::ImGuiRenderer::setup_render_state
          (ImGuiRenderer *this,Ptr<CommandBuffer> *command_buffer,int fb_width,int fb_height,
          uint32_t current_frame)

{
  CommandBuffer *pCVar1;
  undefined1 auVar2 [16];
  initializer_list<std::shared_ptr<myvk::DescriptorSet>_> __l;
  initializer_list<VkViewport> __l_00;
  allocator_type local_91;
  _Vector_base<VkViewport,_std::allocator<VkViewport>_> local_90;
  int local_78;
  int local_74;
  ImDrawData *local_70;
  __shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2> local_68;
  undefined1 local_58 [8];
  pointer puStack_50;
  pointer local_48;
  __shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_78 = fb_height;
  local_74 = fb_width;
  local_70 = ImGui::GetDrawData();
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<myvk::GraphicsPipeline,void>
            ((__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2> *)&local_90,
             &(this->m_pipeline).
              super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>);
  CommandBuffer::CmdBindPipeline(pCVar1,(Ptr<PipelineBase> *)&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_90._M_impl.super__Vector_impl_data._M_finish);
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&local_68,
             &(this->m_descriptor_set).
              super___shared_ptr<myvk::DescriptorSet,_(__gnu_cxx::_Lock_policy)2>);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_68;
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
            *)&local_90,__l,&local_91);
  std::__shared_ptr<myvk::PipelineBase,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<myvk::GraphicsPipeline,void>
            (local_40,&(this->m_pipeline).
                       super___shared_ptr<myvk::GraphicsPipeline,_(__gnu_cxx::_Lock_policy)2>);
  local_58 = (undefined1  [8])0x0;
  puStack_50 = (pointer)0x0;
  local_48 = (pointer)0x0;
  CommandBuffer::CmdBindDescriptorSets
            (pCVar1,(vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
                     *)&local_90,(Ptr<PipelineBase> *)local_40,
             (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_58);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  std::
  vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
  ::~vector((vector<std::shared_ptr<myvk::DescriptorSet>,_std::allocator<std::shared_ptr<myvk::DescriptorSet>_>_>
             *)&local_90);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68._M_refcount);
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_90,
             &(this->m_vertex_buffers).
              super__Vector_base<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
              ._M_impl.super__Vector_impl_data._M_start[current_frame].
              super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  CommandBuffer::CmdBindVertexBuffer(pCVar1,(Ptr<BufferBase> *)&local_90,0,0);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_90._M_impl.super__Vector_impl_data._M_finish);
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  std::__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<myvk::Buffer,void>
            ((__shared_ptr<myvk::BufferBase,(__gnu_cxx::_Lock_policy)2> *)&local_90,
             &(this->m_index_buffers).
              super__Vector_base<std::shared_ptr<myvk::Buffer>,_std::allocator<std::shared_ptr<myvk::Buffer>_>_>
              ._M_impl.super__Vector_impl_data._M_start[current_frame].
              super___shared_ptr<myvk::Buffer,_(__gnu_cxx::_Lock_policy)2>);
  CommandBuffer::CmdBindIndexBuffer(pCVar1,(Ptr<BufferBase> *)&local_90,0,VK_INDEX_TYPE_UINT16);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
             &local_90._M_impl.super__Vector_impl_data._M_finish);
  pCVar1 = (command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  puStack_50 = (pointer)CONCAT44((float)local_78,(float)local_74);
  local_58 = (undefined1  [8])0x0;
  local_48 = (pointer)0x3f80000000000000;
  __l_00._M_len = 1;
  __l_00._M_array = (iterator)local_58;
  std::vector<VkViewport,_std::allocator<VkViewport>_>::vector
            ((vector<VkViewport,_std::allocator<VkViewport>_> *)&local_90,__l_00,
             (allocator_type *)&local_68);
  CommandBuffer::CmdSetViewport(pCVar1,(vector<VkViewport,_std::allocator<VkViewport>_> *)&local_90)
  ;
  std::_Vector_base<VkViewport,_std::allocator<VkViewport>_>::~_Vector_base(&local_90);
  auVar2._8_8_ = 0;
  auVar2._0_4_ = (local_70->DisplaySize).x;
  auVar2._4_4_ = (local_70->DisplaySize).y;
  auVar2 = divps(_DAT_0027cf50,auVar2);
  local_90._M_impl.super__Vector_impl_data._M_start = auVar2._0_8_;
  local_58 = (undefined1  [8])
             CONCAT44(-1.0 - (local_70->DisplayPos).y * auVar2._4_4_,
                      -1.0 - (local_70->DisplayPos).x * auVar2._0_4_);
  CommandBuffer::CmdPushConstants
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,&this->m_pipeline_layout,1,0,8,&local_90);
  CommandBuffer::CmdPushConstants
            ((command_buffer->super___shared_ptr<myvk::CommandBuffer,_(__gnu_cxx::_Lock_policy)2>).
             _M_ptr,&this->m_pipeline_layout,1,8,8,local_58);
  return;
}

Assistant:

void ImGuiRenderer::setup_render_state(const Ptr<CommandBuffer> &command_buffer, int fb_width, int fb_height,
                                       uint32_t current_frame) const {
	ImDrawData *draw_data = ImGui::GetDrawData();

	{
		command_buffer->CmdBindPipeline(m_pipeline);
		command_buffer->CmdBindDescriptorSets({m_descriptor_set}, m_pipeline, {});
		command_buffer->CmdBindVertexBuffer(m_vertex_buffers[current_frame], 0);
		command_buffer->CmdBindIndexBuffer(m_index_buffers[current_frame], 0,
		                                   sizeof(ImDrawIdx) == 2 ? VK_INDEX_TYPE_UINT16 : VK_INDEX_TYPE_UINT32);
	}

	// Setup viewport:
	{
		VkViewport viewport;
		viewport.x = 0;
		viewport.y = 0;
		viewport.width = (float)fb_width;
		viewport.height = (float)fb_height;
		viewport.minDepth = 0.0f;
		viewport.maxDepth = 1.0f;
		command_buffer->CmdSetViewport({viewport});
	}

	// Setup scale and translation:
	// Our visible imgui space lies from draw_data->DisplayPps (top left) to
	// draw_data->DisplayPos+data_data->DisplaySize (bottom right). DisplayPos is (0,0) for single viewport apps.
	{
		float scale[] = {2.0f / draw_data->DisplaySize.x, 2.0f / draw_data->DisplaySize.y};
		float translate[] = {-1.0f - draw_data->DisplayPos.x * scale[0], -1.0f - draw_data->DisplayPos.y * scale[1]};
		command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_VERTEX_BIT, sizeof(float) * 0,
		                                 sizeof(scale), scale);
		command_buffer->CmdPushConstants(m_pipeline_layout, VK_SHADER_STAGE_VERTEX_BIT, sizeof(float) * 2,
		                                 sizeof(translate), translate);
	}
}